

Human: Reconstruct the original C/C++ source from this Ghidra decompilation:

# SPandVC.cpp
# Opt level: O2

void __thiscall Graph::printResult(Graph *this,uint rootOrder,uint pointOrder)

{
  pointer ppVVar1;
  V *pVVar2;
  ostream *poVar3;
  undefined8 *puVar4;
  long lVar5;
  V *unaff_R14;
  ulong uVar6;
  vector<unsigned_int,_std::allocator<unsigned_int>_> result;
  
  if (rootOrder == pointOrder) {
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar3);
    return;
  }
  result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_start = (pointer)0x0;
  result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_finish = (pointer)0x0;
  result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
  super__Vector_impl_data._M_end_of_storage = (pointer)0x0;
  ppVVar1 = (this->verticesVector).super__Vector_base<V_*,_std::allocator<V_*>_>._M_impl.
            super__Vector_impl_data._M_start;
  for (lVar5 = 0;
      (long)(this->verticesVector).super__Vector_base<V_*,_std::allocator<V_*>_>._M_impl.
            super__Vector_impl_data._M_finish - (long)ppVVar1 >> 3 != lVar5; lVar5 = lVar5 + 1) {
    pVVar2 = ppVVar1[lVar5];
    if (pVVar2->order == pointOrder) {
      unaff_R14 = pVVar2;
    }
  }
  for (; unaff_R14->pParentVertex != (V *)0x0; unaff_R14 = unaff_R14->pParentVertex) {
    std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&result,&unaff_R14->order);
  }
  std::vector<unsigned_int,_std::allocator<unsigned_int>_>::push_back(&result,&unaff_R14->order);
  if (*(uint *)((long)result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_start +
               (((long)result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_finish -
                (long)result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl
                      .super__Vector_impl_data._M_start) * 0x40000000 + -0x100000000 >> 0x1e)) !=
      rootOrder) {
    puVar4 = (undefined8 *)__cxa_allocate_exception(8);
    *puVar4 = "the path does not exsit.";
    __cxa_throw(puVar4,&char_const*::typeinfo,0);
  }
  uVar6 = (ulong)((long)result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                        _M_impl.super__Vector_impl_data._M_finish -
                 (long)result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>.
                       _M_impl.super__Vector_impl_data._M_start) >> 2 & 0xffffffff;
  while (uVar6 = uVar6 - 1, 0 < (int)uVar6) {
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::operator<<(poVar3,'-');
  }
  if ((long)result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_finish -
      (long)result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>._M_impl.
            super__Vector_impl_data._M_start != 4) {
    poVar3 = std::ostream::_M_insert<unsigned_long>((ulong)&std::cout);
    std::endl<char,std::char_traits<char>>(poVar3);
  }
  std::_Vector_base<unsigned_int,_std::allocator<unsigned_int>_>::~_Vector_base
            (&result.super__Vector_base<unsigned_int,_std::allocator<unsigned_int>_>);
  return;
}

Assistant:

void Graph::printResult(unsigned rootOrder,unsigned pointOrder)
{
    
    if(rootOrder == pointOrder)
    {
        std::cout<< rootOrder << std::endl;
        return;
    }


    V *Tmp;
    std::vector<unsigned> result;
    for(int i = 0; i < this->verticesVector.size(); i++)
    {
        if(pointOrder == this->verticesVector[i]->order)
        {
            Tmp = this->verticesVector[i];
        }
    }
    
    while (Tmp->pParentVertex != NULL)
    {
        result.push_back(Tmp->order);
        Tmp = Tmp->pParentVertex;
    }
    result.push_back(Tmp->order);
    int theLastIndex = result.size()-1;
    if(result[theLastIndex]!=rootOrder)
    {
        throw "the path does not exsit.";
        return;
    }
    else
    {
        for(int i = result.size()-1; i > 0; i--)
        {
            std::cout << result[i] <<'-';
        }
        if(result.size()!=1)
        {
            std::cout << result[0] << std::endl;
        }
    }
}